

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_t * matd_create(int rows,int cols)

{
  matd_t *m;
  int cols_local;
  int rows_local;
  
  if (rows < 0) {
    __assert_fail("rows >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x2f,"matd_t *matd_create(int, int)");
  }
  if (-1 < cols) {
    if ((rows == 0) || (cols == 0)) {
      _cols_local = matd_create_scalar(0.0);
    }
    else {
      _cols_local = (matd_t *)calloc(1,(long)(rows * cols) * 8 + 8);
      _cols_local->nrows = rows;
      _cols_local->ncols = cols;
    }
    return _cols_local;
  }
  __assert_fail("cols >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x30,"matd_t *matd_create(int, int)");
}

Assistant:

matd_t *matd_create(int rows, int cols)
{
    assert(rows >= 0);
    assert(cols >= 0);

    if (rows == 0 || cols == 0)
        return matd_create_scalar(0);

    matd_t *m = calloc(1, sizeof(matd_t) + (rows*cols*sizeof(double)));
    m->nrows = rows;
    m->ncols = cols;

    return m;
}